

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPreData.cpp
# Opt level: O0

void __thiscall HPreData::print(HPreData *this,int k)

{
  bool bVar1;
  _Setw _Var2;
  ostream *poVar3;
  reference pvVar4;
  size_type sVar5;
  reference pvVar6;
  int in_ESI;
  int *in_RDI;
  size_t i_5;
  size_t i_4;
  int ind;
  size_t j;
  int i_3;
  int rows;
  size_t i_2;
  size_t i_1;
  size_t i;
  char buff [4];
  ulong local_78;
  ulong local_68;
  int local_54;
  ulong local_50;
  int local_44;
  int local_40;
  ulong local_38;
  ulong local_28;
  ulong local_18;
  char local_10 [4];
  int local_c;
  
  local_c = in_ESI;
  poVar3 = std::operator<<((ostream *)&std::cout,"N=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*in_RDI);
  poVar3 = std::operator<<(poVar3,",  M=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI[1]);
  poVar3 = std::operator<<(poVar3,",  NZ= ");
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)*in_RDI);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar4);
  std::operator<<(poVar3,'\n');
  std::operator<<((ostream *)&std::cout,"\n-----in-------\n");
  std::operator<<((ostream *)&std::cout,"\n-----cost-----\n");
  if (local_c == 0) {
    for (local_18 = 0;
        sVar5 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x18)),
        local_18 < sVar5; local_18 = local_18 + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x18),local_18);
      sprintf(local_10,"%2.1g ",*pvVar6);
      _Var2 = std::setw(5);
      poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
      std::operator<<(poVar3,local_10);
    }
  }
  if (local_c == 1) {
    for (local_28 = 0;
        sVar5 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xa8)),
        local_28 < sVar5; local_28 = local_28 + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xa8),local_28);
      sprintf(local_10,"%2.1g ",*pvVar6);
      _Var2 = std::setw(5);
      poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
      std::operator<<(poVar3,local_10);
    }
  }
  if (local_c == 2) {
    for (local_38 = 0;
        sVar5 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xa8)),
        local_38 < sVar5; local_38 = local_38 + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xa8),local_38);
      sprintf(local_10,"%2.1g ",*pvVar6);
      _Var2 = std::setw(5);
      poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
      std::operator<<(poVar3,local_10);
    }
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"------A-|-b-----\n");
  local_40 = in_RDI[1];
  if (local_c != 0) {
    local_40 = in_RDI[2];
  }
  for (local_44 = 0; local_44 < local_40; local_44 = local_44 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x90),(long)local_44);
    if (*pvVar4 != 0) {
      for (local_50 = 0;
          sVar5 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 6)),
          local_50 < sVar5 - 1; local_50 = local_50 + 1) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),local_50);
        local_54 = *pvVar4;
        while( true ) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc),(long)local_54);
          bVar1 = false;
          if (*pvVar4 != local_44) {
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x66),local_50);
            bVar1 = local_54 < *pvVar4;
          }
          if (!bVar1) break;
          local_54 = local_54 + 1;
        }
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x8a),local_50);
        if (*pvVar4 != 0) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc),(long)local_54);
          if ((*pvVar4 == local_44) &&
             (pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x66),local_50),
             local_54 < *pvVar4)) {
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x12),
                                (long)local_54);
            sprintf(local_10,"%2.1g ",*pvVar6);
            _Var2 = std::setw(5);
            poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
            std::operator<<(poVar3,local_10);
          }
          else {
            _Var2 = std::setw(5);
            poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
            std::operator<<(poVar3,"   ");
          }
        }
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"  |   ");
      _Var2 = std::setw(5);
      poVar3 = std::operator<<(poVar3,_Var2);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2a),(long)local_44)
      ;
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar6);
      poVar3 = std::operator<<(poVar3," < < ");
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x30),(long)local_44)
      ;
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar6);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  std::operator<<((ostream *)&std::cout,"------l------\n");
  for (local_68 = 0;
      sVar5 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e)),
      local_68 < sVar5; local_68 = local_68 + 1) {
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e),local_68);
    if (*pvVar6 <= -1e+200) {
      sprintf(local_10,"-inf");
    }
    else {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e),local_68);
      sprintf(local_10,"%2.1g ",*pvVar6);
    }
    _Var2 = std::setw(5);
    poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
    std::operator<<(poVar3,local_10);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"------u------\n");
  for (local_78 = 0;
      sVar5 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x24)),
      local_78 < sVar5; local_78 = local_78 + 1) {
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x24),local_78);
    if (1e+200 < *pvVar6 || *pvVar6 == 1e+200) {
      sprintf(local_10,"inf");
    }
    else {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x24),local_78);
      sprintf(local_10,"%2.1g ",*pvVar6);
    }
    _Var2 = std::setw(5);
    poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
    std::operator<<(poVar3,local_10);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void HPreData::print(int k) {
	cout<<"N="<<numCol<<",  M="<<numRow<<",  NZ= "<<Astart[numCol]<<'\n';
	cout<<"\n-----in-------\n";

	char buff [4];
	cout<<"\n-----cost-----\n";

	if (k==0) {
		for (size_t i=0;i<colCost.size();i++) {
			sprintf(buff, "%2.1g ", colCost[i]);
			cout<<std::setw(5)<<buff;
		}
	}

	if (k==1) {
		for (size_t i=0;i<colCostAtEl.size();i++) {
			sprintf(buff, "%2.1g ", colCostAtEl[i]);
			cout<<std::setw(5)<<buff;
		}
	}

	if (k==2) {
		for (size_t i=0;i<colCostAtEl.size();i++) {
			sprintf(buff, "%2.1g ", colCostAtEl[i]);
			cout<<std::setw(5)<<buff;
		}
	}
	cout<<endl;
	cout<<"------A-|-b-----\n";
	int rows= numRow;
	if (k)
		 rows= numRowOriginal;

	for (int i=0;i<rows;i++) {
		if (flagRow[i] ) {
			for (size_t j=0;j<Astart.size()-1;j++) {

				int ind = Astart[j];
				while (Aindex[ind]!=i && ind<Aend[j])
					ind++;

				if (!flagCol[j])
					continue;

				//if a_ij is nonzero print
				if (Aindex[ind]==i && ind<Aend[j])
				{
					sprintf(buff, "%2.1g ", Avalue[ind]);
					cout<<std::setw(5)<<buff;
					}
				else cout<<std::setw(5)<<"   ";

			}
			cout<<"  |   "<<std::setw(5)<<rowLower[i]<<" < < "<<rowUpper[i]<<endl;
		}
	}
	cout<<"------l------\n";
	for (size_t i=0;i<colLower.size();i++) {
		if (colLower[i]>-HSOL_CONST_INF)
			sprintf(buff, "%2.1g ", colLower[i]);
		else
			sprintf(buff, "-inf");
		cout<<setw(5)<<buff;
	}
	cout<<endl;
	cout<<"------u------\n";
	for (size_t i=0;i<colUpper.size();i++) {
		if (colUpper[i]<HSOL_CONST_INF)
			sprintf(buff, "%2.1g ", colUpper[i]);
		else
			sprintf(buff, "inf");
		cout<<setw(5)<<buff;
	}
	cout<<endl;
}